

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation.cpp
# Opt level: O3

future<rlottie::Surface> __thiscall
RenderTaskScheduler::process(RenderTaskScheduler *this,SharedRenderTask *task)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  uint uVar2;
  element_type *peVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  uint uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  uint uVar9;
  future<rlottie::Surface> fVar10;
  
  peVar3 = ((__shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2> *)&in_RDX->_vptr__Sp_counted_base)
           ->_M_ptr;
  peVar4 = (peVar3->receiver).super___basic_future<rlottie::Surface>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (peVar3->receiver).super___basic_future<rlottie::Surface>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  uVar9 = 0;
  (peVar3->receiver).super___basic_future<rlottie::Surface>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)this = peVar4;
  (this->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)p_Var5;
  (peVar3->receiver).super___basic_future<rlottie::Surface>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  LOCK();
  p_Var1 = &task[3].super___shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  uVar2 = *(uint *)&p_Var1->_M_pi;
  *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
  UNLOCK();
  uVar7 = *(uint *)&(task->super___shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  _Var8._M_pi = in_RDX;
  if (uVar7 != 0) {
    do {
      bVar6 = TaskQueue<std::shared_ptr<RenderTask>_>::try_push
                        ((TaskQueue<std::shared_ptr<RenderTask>_> *)
                         (((ulong)(uVar2 + uVar9) % (ulong)uVar7) * 0xb0 +
                         (long)task[2].super___shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr),(shared_ptr<RenderTask> *)in_RDX);
      _Var8._M_pi = extraout_RDX;
      if (bVar6) goto LAB_0013d741;
      uVar9 = uVar9 + 1;
      uVar7 = *(uint *)&(task->super___shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    } while (uVar9 != uVar7);
    if (uVar9 != 0) {
      TaskQueue<std::shared_ptr<RenderTask>_>::push
                ((TaskQueue<std::shared_ptr<RenderTask>_> *)
                 (((ulong)uVar2 % (ulong)uVar9) * 0xb0 +
                 (long)task[2].super___shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2>._M_ptr),
                 (shared_ptr<RenderTask> *)in_RDX);
      _Var8._M_pi = extraout_RDX_00;
    }
  }
LAB_0013d741:
  fVar10.super___basic_future<rlottie::Surface>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var8._M_pi;
  fVar10.super___basic_future<rlottie::Surface>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (future<rlottie::Surface>)
         fVar10.super___basic_future<rlottie::Surface>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::future<Surface> process(SharedRenderTask task)
    {
        auto receiver = std::move(task->receiver);
        auto i = _index++;

        for (unsigned n = 0; n != _count; ++n) {
            if (_q[(i + n) % _count].try_push(std::move(task))) return receiver;
        }

        if (_count > 0) {
            _q[i % _count].push(std::move(task));
        }

        return receiver;
    }